

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *
fmt::v10::detail::make_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[6]>
          (char (*val) [6])

{
  longlong in_RSI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *in_RDI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *arg;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pbVar1;
  size_t local_30;
  
  pbVar1 = in_RDI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (in_RDI);
  pbVar1->type_ = cstring_type;
  (pbVar1->value_).field_0.long_long_value = in_RSI;
  (pbVar1->value_).field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T& val) -> basic_format_arg<Context> {
  auto arg = basic_format_arg<Context>();
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_arg<true, Context>(val);
  return arg;
}